

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O0

void __thiscall
TPZGenSubStruct::IdentifyEqNumbers
          (TPZGenSubStruct *this,TPZSubCompMesh *sub,TPZVec<int> *global,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *globinv)

{
  int iVar1;
  int iVar2;
  TPZAdmChunkVector<TPZConnect,_10> *this_00;
  int64_t iVar3;
  int64_t iVar4;
  TPZCompMesh *this_01;
  TPZConnect *pTVar5;
  int *piVar6;
  mapped_type_conflict4 *pmVar7;
  TPZVec<int> *in_RDX;
  TPZCompMesh *in_RSI;
  long in_RDI;
  int ieq;
  int locsize;
  int globpos;
  int locpos;
  int globseq;
  int locseq;
  int glob;
  int ic;
  TPZCompMesh *super;
  TPZCompMesh *subcomp;
  int ncon;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int iVar8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar9;
  
  this_00 = TPZCompMesh::ConnectVec(in_RSI);
  iVar3 = TPZChunkVector<TPZConnect,_10>::NElements(&this_00->super_TPZChunkVector<TPZConnect,_10>);
  iVar4 = TPZCompMesh::NEquations
                    ((TPZCompMesh *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  uVar9 = 0xffffffff;
  (*in_RDX->_vptr_TPZVec[2])(in_RDX,iVar4,&stack0xffffffffffffffcc);
  this_01 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
  for (iVar8 = 0; iVar8 < (int)iVar3; iVar8 = iVar8 + 1) {
    iVar4 = TPZSubCompMesh::NodeIndex
                      ((TPZSubCompMesh *)CONCAT44(uVar9,in_stack_ffffffffffffffc8),(int64_t)this_01,
                       (TPZCompMesh *)CONCAT44(iVar8,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffb8 = (int)iVar4;
    if (in_stack_ffffffffffffffb8 != -1) {
      TPZCompMesh::ConnectVec(in_RSI);
      pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                         ((TPZChunkVector<TPZConnect,_10> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      TPZConnect::SequenceNumber(pTVar5);
      TPZCompMesh::ConnectVec(this_01);
      pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                         ((TPZChunkVector<TPZConnect,_10> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      TPZConnect::SequenceNumber(pTVar5);
      TPZCompMesh::Block(in_RSI);
      iVar1 = TPZBlock::Position((TPZBlock *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                 in_stack_ffffffffffffff7c);
      TPZCompMesh::Block(this_01);
      iVar2 = TPZBlock::Position((TPZBlock *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                 in_stack_ffffffffffffff7c);
      TPZCompMesh::Block(in_RSI);
      in_stack_ffffffffffffffa4 =
           TPZBlock::Size((TPZBlock *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c);
      for (in_stack_ffffffffffffffa0 = 0; in_stack_ffffffffffffffa0 < in_stack_ffffffffffffffa4;
          in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1) {
        in_stack_ffffffffffffff80 = iVar2 + in_stack_ffffffffffffffa0;
        piVar6 = TPZVec<int>::operator[](in_RDX,(long)(iVar1 + in_stack_ffffffffffffffa0));
        *piVar6 = in_stack_ffffffffffffff80;
        in_stack_ffffffffffffff84 = iVar1 + in_stack_ffffffffffffffa0;
        in_stack_ffffffffffffff9c = iVar2 + in_stack_ffffffffffffffa0;
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)this_01,(key_type *)CONCAT44(iVar8,in_stack_ffffffffffffffb8));
        *pmVar7 = in_stack_ffffffffffffff84;
      }
    }
  }
  return;
}

Assistant:

void TPZGenSubStruct::IdentifyEqNumbers(TPZSubCompMesh *sub, TPZVec<int> &global, std::map<int,int> &globinv)
{
	int ncon = sub->ConnectVec().NElements();
	// ncon is the number of connects of the subcompmesh
	TPZCompMesh *subcomp = (TPZCompMesh *) sub;
	global.Resize(subcomp->NEquations(),-1);
	TPZCompMesh *super = fCMesh.operator->();
	int ic;
#ifdef PZ_LOG_STOP
	std::stringstream sout;
	sout << "total submesh connects/glob/loc ";
#endif
	for(ic=0; ic<ncon; ic++)
	{
		int glob = sub->NodeIndex(ic,super);
		// continue is the connect is internal
		if(glob == -1) continue;
		int locseq = sub->ConnectVec()[ic].SequenceNumber();
		int globseq = super->ConnectVec()[glob].SequenceNumber();
		int locpos = sub->Block().Position(locseq);
		int globpos = super->Block().Position(globseq);
		int locsize = sub->Block().Size(locseq);
		//    int globsize = super->Block().Size(globseq);
		int ieq;
		for(ieq =0; ieq<locsize; ieq++)
		{
#ifdef PZ_LOG_STOP
			sout << ic << "/" << globpos+ieq << "/" << locpos+ieq << " ";
#endif
			global[locpos+ieq] = globpos+ieq;
			globinv[globpos+ieq] = locpos+ieq;
		}
	}
#ifdef PZ_LOG_STOP
	LOGPZ_DEBUG(logger,sout.str())
#endif
}